

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_phase_callback_registry.cpp
# Opt level: O0

void __thiscall
sc_core::sc_phase_callback_registry::do_callback(sc_phase_callback_registry *this,sc_status s)

{
  uint uVar1;
  bool bVar2;
  pointer peVar3;
  uint in_ESI;
  long in_RDI;
  hierarchy_scope scope;
  it_type end;
  it_type it;
  storage_type *vec;
  vector<sc_core::sc_phase_callback_registry::entry,_std::allocator<sc_core::sc_phase_callback_registry::entry>_>
  *in_stack_ffffffffffffffa8;
  __normal_iterator<const_sc_core::sc_phase_callback_registry::entry_*,_std::vector<sc_core::sc_phase_callback_registry::entry,_std::allocator<sc_core::sc_phase_callback_registry::entry>_>_>
  *in_stack_ffffffffffffffb0;
  sc_object *in_stack_ffffffffffffffc8;
  hierarchy_scope *in_stack_ffffffffffffffd0;
  __normal_iterator<const_sc_core::sc_phase_callback_registry::entry_*,_std::vector<sc_core::sc_phase_callback_registry::entry,_std::allocator<sc_core::sc_phase_callback_registry::entry>_>_>
  local_20;
  long local_18;
  uint local_c;
  
  local_18 = in_RDI + 8;
  local_c = in_ESI;
  local_20._M_current =
       (entry *)std::
                vector<sc_core::sc_phase_callback_registry::entry,_std::allocator<sc_core::sc_phase_callback_registry::entry>_>
                ::begin(in_stack_ffffffffffffffa8);
  std::
  vector<sc_core::sc_phase_callback_registry::entry,_std::allocator<sc_core::sc_phase_callback_registry::entry>_>
  ::end(in_stack_ffffffffffffffa8);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (in_stack_ffffffffffffffb0,
                       (__normal_iterator<const_sc_core::sc_phase_callback_registry::entry_*,_std::vector<sc_core::sc_phase_callback_registry::entry,_std::allocator<sc_core::sc_phase_callback_registry::entry>_>_>
                        *)in_stack_ffffffffffffffa8);
    uVar1 = local_c;
    if (!bVar2) break;
    peVar3 = __gnu_cxx::
             __normal_iterator<const_sc_core::sc_phase_callback_registry::entry_*,_std::vector<sc_core::sc_phase_callback_registry::entry,_std::allocator<sc_core::sc_phase_callback_registry::entry>_>_>
             ::operator->(&local_20);
    if ((uVar1 & peVar3->mask) != 0) {
      in_stack_ffffffffffffffb0 = &local_20;
      __gnu_cxx::
      __normal_iterator<const_sc_core::sc_phase_callback_registry::entry_*,_std::vector<sc_core::sc_phase_callback_registry::entry,_std::allocator<sc_core::sc_phase_callback_registry::entry>_>_>
      ::operator->(in_stack_ffffffffffffffb0);
      sc_object::hierarchy_scope::hierarchy_scope
                (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
      __gnu_cxx::
      __normal_iterator<const_sc_core::sc_phase_callback_registry::entry_*,_std::vector<sc_core::sc_phase_callback_registry::entry,_std::allocator<sc_core::sc_phase_callback_registry::entry>_>_>
      ::operator->(in_stack_ffffffffffffffb0);
      sc_object::do_simulation_phase_callback((sc_object *)0x2b77dc);
      sc_object::hierarchy_scope::~hierarchy_scope((hierarchy_scope *)in_stack_ffffffffffffffb0);
    }
    __gnu_cxx::
    __normal_iterator<const_sc_core::sc_phase_callback_registry::entry_*,_std::vector<sc_core::sc_phase_callback_registry::entry,_std::allocator<sc_core::sc_phase_callback_registry::entry>_>_>
    ::operator++(&local_20);
  }
  return;
}

Assistant:

void
sc_phase_callback_registry::do_callback( sc_status s ) const
{
    typedef storage_type::const_iterator it_type;
    storage_type const & vec = m_cb_vec;

    for(it_type it = vec.begin(), end = vec.end(); it != end; ++it) {
        if( s & it->mask ) {
            sc_object::hierarchy_scope scope(it->target);
            it->target->do_simulation_phase_callback();
        }
    }
}